

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O2

iterator __thiscall
re2::SparseArray<re2::NFA::Thread_*>::set_existing
          (SparseArray<re2::NFA::Thread_*> *this,int i,Thread *v)

{
  bool bVar1;
  
  DebugCheckInvariants(this);
  bVar1 = has_index(this,i);
  if (bVar1) {
    (this->dense_).
    super__Vector_base<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
    ._M_impl.super__Vector_impl_data._M_start[this->sparse_to_dense_[i]].second = v;
    DebugCheckInvariants(this);
    return (iterator)
           ((this->dense_).
            super__Vector_base<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
            ._M_impl.super__Vector_impl_data._M_start + this->sparse_to_dense_[i]);
  }
  __assert_fail("has_index(i)",
                "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                ,0x176,
                "typename SparseArray<Value>::iterator re2::SparseArray<re2::NFA::Thread *>::set_existing(int, Value) [Value = re2::NFA::Thread *]"
               );
}

Assistant:

typename SparseArray<Value>::iterator
SparseArray<Value>::set_existing(int i, Value v) {
  DebugCheckInvariants();
  DCHECK(has_index(i));
  dense_[sparse_to_dense_[i]].second = v;
  DebugCheckInvariants();
  return dense_.begin() + sparse_to_dense_[i];
}